

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

string * __thiscall
inja::Parser::parse_filename_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  string_view *__t;
  ulong uVar1;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  if ((this->tok).kind != String) {
    Token::describe_abi_cxx11_(&local_38,&this->tok);
    ::std::operator+(&local_78,"expected string, got \'",&local_38);
    ::std::operator+(&local_58,&local_78,"\'");
    throw_parser_error(this,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  __t = &(this->tok).text;
  uVar1 = (this->tok).text._M_len;
  if (uVar1 < 2) {
    ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_38,__t,&local_79);
    ::std::operator+(&local_78,"expected filename, got \'",&local_38);
    ::std::operator+(&local_58,&local_78,"\'");
    throw_parser_error(this,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_38);
    uVar1 = __t->_M_len;
  }
  local_58._0_16_ = std::basic_string_view<char,_std::char_traits<char>_>::substr(__t,1,uVar1 - 2);
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_58,
             (allocator<char> *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

std::string parse_filename() const {
    if (tok.kind != Token::Kind::String) {
      throw_parser_error("expected string, got '" + tok.describe() + "'");
    }

    if (tok.text.length() < 2) {
      throw_parser_error("expected filename, got '" + static_cast<std::string>(tok.text) + "'");
    }

    // Remove first and last character ""
    return std::string {tok.text.substr(1, tok.text.length() - 2)};
  }